

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void wabt::anon_unknown_0::CWriter::SerializeFuncType(FuncType *func_type,string *serialized_type)

{
  long lVar1;
  uint uVar2;
  string *psVar3;
  char *pcVar4;
  char cVar5;
  Index IVar6;
  Type TVar7;
  string *psVar8;
  ulong __len;
  string_view input;
  undefined8 uStack_70;
  char acStack_68 [4];
  uint local_64;
  uint local_60;
  Index local_5c;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Type local_48;
  uint local_40;
  Type TStack_3c;
  Index i_1;
  uint local_34;
  char *pcStack_30;
  Index i;
  char *next_byte;
  char *mangled_signature;
  string *psStack_18;
  uint len;
  string *serialized_type_local;
  FuncType *func_type_local;
  
  uStack_70 = 0x1de499;
  psStack_18 = serialized_type;
  serialized_type_local = (string *)func_type;
  local_5c = FuncType::GetNumParams(func_type);
  uStack_70 = 0x1de4a5;
  IVar6 = FuncType::GetNumResults((FuncType *)serialized_type_local);
  mangled_signature._4_4_ = local_5c + 1 + IVar6;
  lVar1 = -((ulong)mangled_signature._4_4_ + 0xf & 0xfffffffffffffff0);
  pcStack_30 = acStack_68 + lVar1;
  local_34 = 0;
  next_byte = pcStack_30;
  while( true ) {
    psVar8 = serialized_type_local;
    local_60 = local_34;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de4ed;
    IVar6 = FuncType::GetNumParams((FuncType *)psVar8);
    psVar8 = serialized_type_local;
    uVar2 = local_34;
    if (IVar6 <= local_60) break;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de502;
    TVar7 = FuncType::GetParamType((FuncType *)psVar8,uVar2);
    TStack_3c = TVar7;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de50f;
    cVar5 = MangleType(TVar7);
    pcVar4 = pcStack_30 + 1;
    *pcStack_30 = cVar5;
    pcStack_30 = pcVar4;
    local_34 = local_34 + 1;
  }
  pcVar4 = pcStack_30 + 1;
  *pcStack_30 = ' ';
  pcStack_30 = pcVar4;
  local_40 = 0;
  while( true ) {
    psVar8 = serialized_type_local;
    local_64 = local_40;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de555;
    IVar6 = FuncType::GetNumResults((FuncType *)psVar8);
    psVar8 = serialized_type_local;
    pcVar4 = next_byte;
    uVar2 = local_40;
    if (IVar6 <= local_64) break;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de56a;
    TVar7 = FuncType::GetResultType((FuncType *)psVar8,uVar2);
    local_48 = TVar7;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de577;
    cVar5 = MangleType(TVar7);
    pcVar4 = pcStack_30 + 1;
    *pcStack_30 = cVar5;
    pcStack_30 = pcVar4;
    local_40 = local_40 + 1;
  }
  psVar8 = (string *)(ulong)mangled_signature._4_4_;
  if ((string *)(pcStack_30 + -(long)next_byte) == psVar8) {
    __len = (ulong)mangled_signature._4_4_;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de5db;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,pcVar4,__len)
    ;
    psVar3 = psStack_18;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de5ec;
    input._M_str = (char *)psVar3;
    input._M_len = (size_t)local_58._M_str;
    sha256((wabt *)local_58._M_len,input,psVar8);
    return;
  }
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x1de5c9;
  __assert_fail("next_byte - mangled_signature == static_cast<ptrdiff_t>(len)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x6b8,
                "static void wabt::(anonymous namespace)::CWriter::SerializeFuncType(const FuncType &, std::string &)"
               );
}

Assistant:

void CWriter::SerializeFuncType(const FuncType& func_type,
                                std::string& serialized_type) {
  unsigned int len = func_type.GetNumParams() + func_type.GetNumResults() + 1;

  char* const mangled_signature = static_cast<char*>(alloca(len));
  char* next_byte = mangled_signature;

  // step 1: serialize each param type
  for (Index i = 0; i < func_type.GetNumParams(); ++i) {
    *next_byte++ = MangleType(func_type.GetParamType(i));
  }

  // step 2: separate params and results with a space
  *next_byte++ = ' ';

  // step 3: serialize each result type
  for (Index i = 0; i < func_type.GetNumResults(); ++i) {
    *next_byte++ = MangleType(func_type.GetResultType(i));
  }

  assert(next_byte - mangled_signature == static_cast<ptrdiff_t>(len));

  // step 4: SHA-256 the whole string
  sha256({mangled_signature, len}, serialized_type);
}